

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O1

void __thiscall w3Interp::f32_Convert_i32u(w3Interp *this)

{
  uint uVar1;
  pointer pwVar2;
  Value *pVVar3;
  
  pVVar3 = w3Stack::value(&this->super_w3Stack,Tag_i32);
  uVar1 = pVVar3->u32;
  w3Stack::AssertTopIsValue(&this->super_w3Stack);
  pwVar2 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
           super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pwVar2[-1].value.tag = Tag_f32;
  pwVar2[-1].value.value.f32 = (float)uVar1;
  return;
}

Assistant:

INTERP (f32_Convert_i32u)
{
    set_f32 ((float)(uint32_t)u32 ());
}